

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnCallIndirectExpr(BinaryReaderIR *this,Index sig_index)

{
  char *__s;
  Offset OVar1;
  FuncType *pFVar2;
  Expr *pEVar3;
  Result RVar4;
  size_t sVar5;
  undefined1 auStack_a8 [8];
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  Expr *local_38;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> expr;
  
  if ((ulong)sig_index <
      (ulong)((long)(this->module_->func_types).
                    super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->module_->func_types).
                    super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    MakeUnique<wabt::CallIndirectExpr>();
    *(undefined1 *)&local_38[1]._vptr_Expr = 1;
    loc.filename.size_._0_4_ = 0;
    loc.filename.size_._4_4_ = 0;
    loc.field_1.field_0.line = 0;
    auStack_a8 = (undefined1  [8])0x0;
    loc.filename.data_._0_4_ = 0;
    loc.filename.data_._4_4_ = 0;
    __s = this->filename_;
    sVar5 = strlen(__s);
    loc.filename.data_._0_4_ = (undefined4)sVar5;
    loc.filename.data_._4_4_ = (undefined4)(sVar5 >> 0x20);
    OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    loc.filename.size_._0_4_ = (undefined4)OVar1;
    loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
    auStack_a8 = (undefined1  [8])__s;
    Var::Var((Var *)((long)&loc.field_1 + 8),sig_index,(Location *)auStack_a8);
    Var::operator=((Var *)&local_38[1].super_intrusive_list_base<wabt::Expr>,
                   (Var *)((long)&loc.field_1 + 8));
    Var::~Var((Var *)((long)&loc.field_1 + 8));
    pEVar3 = local_38;
    pFVar2 = (this->module_->func_types).
             super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
             super__Vector_impl_data._M_start[sig_index];
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
               &local_38[2].super_intrusive_list_base<wabt::Expr>.prev_,&(pFVar2->sig).param_types);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pEVar3[2].loc.field_1.field_0,
               &(pFVar2->sig).result_types);
    local_40._M_head_impl = local_38;
    local_38 = (Expr *)0x0;
    RVar4 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
    if (local_40._M_head_impl != (Expr *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Expr[1])();
    }
    local_40._M_head_impl = (Expr *)0x0;
    if (local_38 != (Expr *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
    return (Result)RVar4.enum_;
  }
  __assert_fail("sig_index < module_->func_types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x29d,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnCallIndirectExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnCallIndirectExpr(Index sig_index) {
  assert(sig_index < module_->func_types.size());
  auto expr = MakeUnique<CallIndirectExpr>();
  expr->decl.has_func_type = true;
  expr->decl.type_var = Var(sig_index, GetLocation());
  expr->decl.sig = module_->func_types[sig_index]->sig;
  return AppendExpr(std::move(expr));
}